

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_ws_session_free(ws_session_t *session)

{
  void *__ptr;
  nh_ws_out_context_t *ctx;
  ulong uVar1;
  
  epoll_ctl(session->server->loop,2,session->socket,(epoll_event *)0x0);
  epoll_ctl(session->server->loop,2,session->timer_fd,(epoll_event *)0x0);
  close(session->timer_fd);
  shutdown(session->socket,2);
  close(session->socket);
  if ((session->store).capacity != 0) {
    if ((session->store).capacity != 0) {
      uVar1 = 0;
      do {
        __ptr = (session->store).items[uVar1];
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < (session->store).capacity);
    }
    free((session->store).items);
  }
  if (session->incomplete_recv != (ws_context_t *)0x0) {
    nh_ws_context_free(session->incomplete_recv);
  }
  while (ctx = session->incomplete_emit, ctx != (nh_ws_out_context_t *)0x0) {
    session->incomplete_emit = ctx->next;
    nh_ws_out_context_free(ctx);
  }
  free(session);
  return;
}

Assistant:

void nh_ws_session_free(ws_session_t *session) {
    // unregister events
    epoll_ctl(session->server->loop, EPOLL_CTL_DEL, session->socket, NULL);
    epoll_ctl(session->server->loop, EPOLL_CTL_DEL, session->timer_fd, NULL);
    // close fd
    close(session->timer_fd);
    shutdown(session->socket, SHUT_RDWR);
    close(session->socket);
    // free memory
    if (session->store.capacity) {
        for (size_t i = 0; i < session->store.capacity; ++i) {
            if (session->store.items[i] != NULL) free(session->store.items[i]);
        }
        free(session->store.items);
    }
    if (session->incomplete_recv != NULL) nh_ws_context_free(session->incomplete_recv);
    nh_ws_out_context_t *tmp_emit;
    while ((tmp_emit = session->incomplete_emit) != NULL) {
        session->incomplete_emit = tmp_emit->next;
        nh_ws_out_context_free(tmp_emit);
    }
    free(session);
}